

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

string * __thiscall
Catch::Matchers::StdString::CasedString::caseSensitivitySuffix_abi_cxx11_(CasedString *this)

{
  allocator<char> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  allocator<char> local_11;
  string *__s;
  
  if (*(int *)in_RSI == 1) {
    __s = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,in_RSI);
    std::allocator<char>::~allocator(&local_11);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string CasedString::caseSensitivitySuffix() const {
            return m_caseSensitivity == CaseSensitive::No
                   ? " (case insensitive)"
                   : std::string();
        }